

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O2

void finish_pass_phuff(j_compress_ptr cinfo)

{
  jpeg_destination_mgr *pjVar1;
  phuff_entropy_ptr entropy;
  
  pjVar1 = cinfo->dest;
  entropy = (phuff_entropy_ptr)cinfo->entropy;
  entropy->next_output_byte = pjVar1->next_output_byte;
  entropy->free_in_buffer = pjVar1->free_in_buffer;
  emit_eobrun(entropy);
  flush_bits(entropy);
  pjVar1 = cinfo->dest;
  pjVar1->next_output_byte = entropy->next_output_byte;
  pjVar1->free_in_buffer = entropy->free_in_buffer;
  return;
}

Assistant:

METHODDEF(void)
finish_pass_phuff(j_compress_ptr cinfo)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Flush out any buffered data */
  emit_eobrun(entropy);
  flush_bits(entropy);

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;
}